

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool implib)

{
  OutputInfo *pOVar1;
  string sStack_38;
  
  if (this->Target->IsImportedTarget == true) {
    cmTarget::ImportedGetFullPath(&sStack_38,this->Target,config,implib);
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    pOVar1 = GetOutputInfo(this,config);
    if (pOVar1 == (OutputInfo *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_38);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)(&pOVar1->OutDir + implib));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDirectory(const std::string& config,
                                   bool implib) const
{
  if (this->IsImported())
    {
    // Return the directory from which the target is imported.
    return
      cmSystemTools::GetFilenamePath(
      this->Target->ImportedGetFullPath(config, implib));
    }
  else if(OutputInfo const* info = this->GetOutputInfo(config))
    {
    // Return the directory in which the target will be built.
    return implib? info->ImpDir : info->OutDir;
    }
  return "";
}